

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O1

_Bool bitset_container_is_subset_run(bitset_container_t *container1,run_container_t *container2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  iVar2 = container1->cardinality;
  if ((iVar2 != -1) && (iVar1 = run_container_cardinality(container2), iVar1 < iVar2)) {
    return false;
  }
  iVar2 = 0;
  uVar3 = 0;
  do {
    bVar10 = 0x3ff < (int)uVar3;
    if (0x3ff < (int)uVar3) {
      return bVar10;
    }
    if (container2->n_runs <= iVar2) {
      lVar4 = (long)(int)uVar3;
      do {
        bVar10 = container1->words[lVar4] == 0;
        if (!bVar10) {
          return bVar10;
        }
        bVar9 = lVar4 != 0x3ff;
        lVar4 = lVar4 + 1;
      } while (bVar9);
      return bVar10;
    }
    uVar5 = container1->words[(int)uVar3];
    if (uVar5 != 0) {
      do {
        if (container2->n_runs <= iVar2) {
          uVar6 = 1;
LAB_0011d33d:
          bVar9 = uVar6 == 0;
          goto LAB_0011d344;
        }
        lVar4 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar8 = (uint)lVar4 | (uVar3 & 0x3ff) << 6;
        uVar6 = 1;
        uVar7 = (uint)container2->runs[iVar2].value;
        if (uVar7 <= uVar8) {
          if (container2->runs[iVar2].length + uVar7 < uVar8) {
            iVar2 = iVar2 + 1;
            uVar6 = 4;
          }
          else {
            uVar5 = uVar5 & uVar5 - 1;
            uVar6 = 0;
          }
        }
        if ((uVar6 & 3) != 0) goto LAB_0011d33d;
      } while (uVar5 != 0);
    }
    uVar3 = uVar3 + 1;
    bVar9 = true;
LAB_0011d344:
    if (!bVar9) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool bitset_container_is_subset_run(const bitset_container_t* container1,
                                    const run_container_t* container2) {
    // todo: this code could be much faster
    if (container1->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container1->cardinality > run_container_cardinality(container2)) {
            return false;
        }
    }
    int32_t i_bitset = 0, i_run = 0;
    while (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS &&
           i_run < container2->n_runs) {
        uint64_t w = container1->words[i_bitset];
        while (w != 0 && i_run < container2->n_runs) {
            uint32_t start = container2->runs[i_run].value;
            uint32_t stop = start + container2->runs[i_run].length;
            uint64_t t = w & (~w + 1);
            uint16_t r = i_bitset * 64 + roaring_trailing_zeroes(w);
            if (r < start) {
                return false;
            } else if (r > stop) {
                i_run++;
                continue;
            } else {
                w ^= t;
            }
        }
        if (w == 0) {
            i_bitset++;
        } else {
            return false;
        }
    }
    if (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS) {
        // terminated iterating on the run containers, check that rest of bitset
        // is empty
        for (; i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS; i_bitset++) {
            if (container1->words[i_bitset] != 0) {
                return false;
            }
        }
    }
    return true;
}